

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_base.hpp
# Opt level: O1

void __thiscall oqpi::worker_base::~worker_base(worker_base *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_worker_base = (_func_int **)&PTR__worker_base_001f8d60;
  this_00 = (this->hTask_).spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->config_).threadAttributes.name_._M_dataplus._M_p;
  paVar2 = &(this->config_).threadAttributes.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~worker_base()
        {}